

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xwinman.c
# Opt level: O3

void process_Xevents(DspInterface dsp)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Window WVar4;
  DspInterface pDVar5;
  DLword DVar6;
  int iVar7;
  Cursor *pCVar8;
  uint uVar9;
  Cursor CVar10;
  uint uVar11;
  u_short upflg;
  Display *pDVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  XEvent report;
  XButtonEvent local_f0 [2];
  
  iVar7 = XPending(dsp->display_id);
  do {
    if (iVar7 == 0) {
      return;
    }
    XNextEvent(dsp->display_id,local_f0);
    pDVar5 = currentdsp;
    WVar4 = dsp->DisplayWindow;
    if (local_f0[0].window != WVar4) {
      if (local_f0[0].window == dsp->LispWindow) {
        if (local_f0[0].type == 7) {
          XSelectInput(currentdsp->display_id,currentdsp->DisplayWindow,currentdsp->EnableEventMask)
          ;
          XFlush(pDVar5->display_id);
        }
        else if (local_f0[0].type == 0x16) {
          uVar2 = dsp->ScrollBarWidth;
          uVar3 = dsp->InternalBorderWidth;
          iVar7 = uVar2 + uVar3 * 2;
          uVar11 = (dsp->Display).width + iVar7;
          if ((uint)local_f0[0].time < uVar11) {
            uVar11 = (uint)local_f0[0].time;
          }
          uVar9 = uVar2 + uVar3 * 2 + 2;
          if ((uint)local_f0[0].time <= uVar9) {
            uVar11 = uVar9;
          }
          uVar11 = uVar11 - iVar7;
          (dsp->Visible).width = uVar11;
          uVar13 = (dsp->Display).height + iVar7;
          if (local_f0[0].time._4_4_ < uVar13) {
            uVar13 = local_f0[0].time._4_4_;
          }
          if (local_f0[0].time._4_4_ <= uVar9) {
            uVar13 = uVar9;
          }
          uVar13 = uVar13 - iVar7;
          (dsp->Visible).height = uVar13;
          XMoveResizeWindow(dsp->display_id,WVar4,0,0,uVar11,uVar13);
          if (noscroll == 0) {
            uVar9 = (uVar2 >> 1) + uVar3 & 0x7fffffff;
            iVar7 = uVar13 + uVar9;
            iVar14 = uVar9 + uVar11;
            iVar15 = (uVar2 >> 1) - uVar3;
            XMoveResizeWindow(dsp->display_id,dsp->VerScrollBar,uVar11,-dsp->InternalBorderWidth,
                              dsp->ScrollBarWidth,(dsp->Visible).height);
            XMoveResizeWindow(dsp->display_id,dsp->HorScrollBar,-dsp->InternalBorderWidth,uVar13,
                              (dsp->Visible).width,dsp->ScrollBarWidth);
            uVar2 = (dsp->Visible).width;
            uVar3 = (dsp->Display).width;
            XMoveResizeWindow(dsp->display_id,dsp->HorScrollButton,
                              (long)(int)((dsp->Visible).x * uVar2) / (long)(int)uVar3 & 0xffffffff,
                              -dsp->InternalBorderWidth,(uVar2 * uVar2) / uVar3 + 1,
                              dsp->ScrollBarWidth);
            uVar2 = (dsp->Visible).height;
            uVar3 = (dsp->Display).height;
            XMoveResizeWindow(dsp->display_id,dsp->VerScrollButton,-dsp->InternalBorderWidth,
                              (long)(int)((dsp->Visible).y * uVar2) / (long)(int)uVar3 & 0xffffffff,
                              dsp->ScrollBarWidth,(uVar2 * uVar2) / uVar3 + 1);
            XMoveResizeWindow(dsp->display_id,dsp->NWGrav,uVar11,uVar13,iVar15,iVar15);
            XMoveResizeWindow(dsp->display_id,dsp->NEGrav,iVar14,uVar13,iVar15,iVar15);
            XMoveResizeWindow(dsp->display_id,dsp->SEGrav,iVar14,iVar7,iVar15,iVar15);
            XMoveResizeWindow(dsp->display_id,dsp->SWGrav,uVar11,iVar7,iVar15,iVar15);
            Scroll(dsp,(dsp->Visible).x,(dsp->Visible).y);
          }
          XFlush(dsp->display_id);
        }
        goto switchD_00141d3f_caseD_9;
      }
      if (noscroll == 0) {
        if (local_f0[0].window == dsp->HorScrollBar) {
          if (local_f0[0].type != 5) {
            if (local_f0[0].type == 4) {
              if (local_f0[0].button == 3) {
                XDefineCursor(dsp->display_id,local_f0[0].window,ScrollRightCursor);
                ScrollRight(dsp);
              }
              else {
                if (local_f0[0].button == 2) {
                  pDVar12 = dsp->display_id;
                  pCVar8 = &HorizThumbCursor;
                  goto LAB_001423e0;
                }
                if (local_f0[0].button == 1) {
                  XDefineCursor(dsp->display_id,local_f0[0].window,ScrollLeftCursor);
                  ScrollLeft(dsp);
                }
              }
            }
            goto switchD_00141d3f_caseD_9;
          }
          if (local_f0[0].button == 3) {
LAB_001422d1:
            pDVar12 = dsp->display_id;
            pCVar8 = &HorizScrollCursor;
LAB_001423e0:
            CVar10 = *pCVar8;
          }
          else {
            if (local_f0[0].button != 2) {
              if (local_f0[0].button != 1) goto switchD_00141d3f_caseD_9;
              goto LAB_001422d1;
            }
            JumpScrollHor(dsp,local_f0[0].x);
            pDVar12 = dsp->display_id;
            pCVar8 = &HorizScrollCursor;
LAB_00142407:
            CVar10 = *pCVar8;
          }
          XDefineCursor(pDVar12,local_f0[0].window,CVar10);
        }
        else if (local_f0[0].window == dsp->VerScrollBar) {
          if (local_f0[0].type == 5) {
            if (local_f0[0].button != 3) {
              if (local_f0[0].button == 2) {
                JumpScrollVer(dsp,local_f0[0].y);
                pDVar12 = dsp->display_id;
                pCVar8 = &VertScrollCursor;
                goto LAB_00142407;
              }
              if (local_f0[0].button != 1) goto switchD_00141d3f_caseD_9;
            }
            pDVar12 = dsp->display_id;
            pCVar8 = &VertScrollCursor;
            goto LAB_001423e0;
          }
          if (local_f0[0].type == 4) {
            if (local_f0[0].button == 3) {
              XDefineCursor(dsp->display_id,local_f0[0].window,ScrollDownCursor);
              ScrollDown(dsp);
            }
            else {
              if (local_f0[0].button == 2) {
                pDVar12 = dsp->display_id;
                pCVar8 = &VertThumbCursor;
                goto LAB_001423e0;
              }
              if (local_f0[0].button == 1) {
                XDefineCursor(dsp->display_id,local_f0[0].window,ScrollUpCursor);
                ScrollUp(dsp);
              }
            }
          }
        }
        else {
          if ((local_f0[0].type == 4 && local_f0[0].window == dsp->NEGrav) &&
             ((char)local_f0[0].button == '\x01')) {
            iVar7 = 3;
          }
          else if ((local_f0[0].window == dsp->SEGrav && local_f0[0].type == 4) &&
                  ((char)local_f0[0].button == '\x01')) {
            iVar7 = 9;
          }
          else if ((local_f0[0].window == dsp->SWGrav && local_f0[0].type == 4) &&
                  ((char)local_f0[0].button == '\x01')) {
            iVar7 = 7;
          }
          else {
            if ((local_f0[0].window != dsp->NWGrav || local_f0[0].type != 4) ||
               ((char)local_f0[0].button != '\x01')) goto switchD_00141d3f_caseD_9;
            iVar7 = 1;
          }
          Set_BitGravity(local_f0,dsp,local_f0[0].window,iVar7);
        }
        goto switchD_00141d3f_caseD_9;
      }
      goto LAB_0014241b;
    }
    switch(local_f0[0].type) {
    case 2:
      bVar1 = SUNLispKeyMap[local_f0[0].button - 7];
      upflg = 0;
      goto LAB_001420b3;
    case 3:
      bVar1 = SUNLispKeyMap[local_f0[0].button - 7];
      upflg = 1;
LAB_001420b3:
      kb_trans((ushort)bVar1,upflg);
      goto LAB_001420b8;
    case 4:
      if (local_f0[0].button - 1 < 7) {
        *EmRealUtilin68K =
             *EmRealUtilin68K & *(ushort *)(&DAT_0014a198 + (ulong)(local_f0[0].button - 1) * 2);
      }
      goto LAB_001420b8;
    case 5:
      if (local_f0[0].button - 1 < 7) {
        *EmRealUtilin68K =
             *EmRealUtilin68K | *(ushort *)(&DAT_0014a1a6 + (ulong)(local_f0[0].button - 1) * 2);
      }
LAB_001420b8:
      DoRing();
      iVar7 = KBDEventFlg + 1;
      bVar16 = -1 < KBDEventFlg;
      KBDEventFlg = iVar7;
      if (bVar16) {
        MachineState.irqcheck = 0;
        MachineState.irqend = 0;
      }
      break;
    case 6:
      *CLastUserActionCell68k = MiscStats->secondstmp;
      DVar6 = ((short)(dsp->Visible).x + (short)local_f0[0].x) - (short)Current_Hot_X;
      *EmMouseX68K = DVar6;
      *EmCursorX68K = DVar6;
      DVar6 = ((short)(dsp->Visible).y + (short)local_f0[0].y) - (short)Current_Hot_Y;
      *EmMouseY68K = DVar6;
      *EmCursorY68K = DVar6;
      break;
    case 7:
      Mouse_Included = 1;
      break;
    case 8:
      Mouse_Included = 0;
      break;
    case 0xc:
      (*dsp->bitblt_to_screen)
                (dsp,(DLword *)0x0,(dsp->Visible).x + (int)local_f0[0].root,
                 (dsp->Visible).y + local_f0[0].root._4_4_,(int)local_f0[0].subwindow,
                 local_f0[0].subwindow._4_4_);
    }
switchD_00141d3f_caseD_9:
    XFlush(dsp->display_id);
LAB_0014241b:
    iVar7 = XPending(dsp->display_id);
  } while( true );
}

Assistant:

void process_Xevents(DspInterface dsp)
{
  XEvent report;

  while (XPending(dsp->display_id)) {
    XNextEvent(dsp->display_id, &report);
    if (report.xany.window == dsp->DisplayWindow) /* Try the most important window first. */
      switch (report.type) {
#ifndef INIT
        case MotionNotify:
          *CLastUserActionCell68k = MiscStats->secondstmp;
          *EmCursorX68K = (*((DLword *)EmMouseX68K)) =
              (short)((report.xmotion.x + dsp->Visible.x) & 0xFFFF) - Current_Hot_X;
          *EmCursorY68K = (*((DLword *)EmMouseY68K)) =
              (short)((report.xmotion.y + dsp->Visible.y) & 0xFFFF) - Current_Hot_Y;
          break;
        case KeyPress:
          kb_trans(SUNLispKeyMap[(report.xkey.keycode) - KEYCODE_OFFSET], FALSE);
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case KeyRelease:
          kb_trans(SUNLispKeyMap[(report.xkey.keycode) - KEYCODE_OFFSET], TRUE);
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_LEFT, FALSE); break;
            case Button2: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_MIDDLE, FALSE); break;
            case Button3: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_RIGHT, FALSE); break;
            case Button4: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFT, FALSE); break;
            case Button5: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFTMIDDLE, FALSE); break;
            case Button5 + 1: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHT, FALSE); break;
            case Button5 + 2: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHTMIDDLE, FALSE); break;
            default: break;
          }
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_LEFT, TRUE); break;
            case Button2: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_MIDDLE, TRUE); break;
            case Button3: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_RIGHT, TRUE); break;
            case Button4: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFT, TRUE); break;
            case Button5: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFTMIDDLE, TRUE); break;
            case Button5 + 1: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHT, TRUE); break;
            case Button5 + 2: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHTMIDDLE, TRUE); break;
            default: break;
          }
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case EnterNotify: Mouse_Included = TRUE; break;
        case LeaveNotify: Mouse_Included = FALSE; break;
#endif
        case Expose:
          (dsp->bitblt_to_screen)(dsp, 0, report.xexpose.x + dsp->Visible.x,
                                  report.xexpose.y + dsp->Visible.y, report.xexpose.width,
                                  report.xexpose.height);
          break;
        default: break;
      }
    else if (report.xany.window == dsp->LispWindow)
      switch (report.xany.type) {
        case ConfigureNotify:
          lisp_Xconfigure(dsp, report.xconfigure.x, report.xconfigure.y, (unsigned)report.xconfigure.width,
                          (unsigned)report.xconfigure.height);
          break;
        case EnterNotify: enable_Xkeyboard(currentdsp); break;
        case LeaveNotify: break;
        case MapNotify:
          /* Turn the blitting to the screen on */
          break;
        case UnmapNotify:
          /* Turn the blitting to the screen off */
          break;
        default: break;
      }
    else if (noscroll) continue;
    else if (report.xany.window == dsp->HorScrollBar)
      switch (report.type) {
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, dsp->HorScrollBar, &ScrollLeftCursor);
              ScrollLeft(dsp);
              break;
            case Button2:
              DefineCursor(dsp, dsp->HorScrollBar, &HorizThumbCursor);
              break;
            case Button3:
              DefineCursor(dsp, dsp->HorScrollBar, &ScrollRightCursor);
              ScrollRight(dsp);
              break;
            default: break;
          } /* end switch */
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            case Button2:
              JumpScrollHor(dsp, report.xbutton.x);
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            default: break;
          } /* end switch */
	  break;
        default: break;
      }
    else if (report.xany.window == dsp->VerScrollBar)
      switch (report.type) {
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &ScrollUpCursor);
              ScrollUp(dsp);
              break;
            case Button2:
              DefineCursor(dsp, report.xany.window, &VertThumbCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &ScrollDownCursor);
              ScrollDown(dsp);
              break;
            default: break;
          } /* end switch */
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            case Button2:
              JumpScrollVer(dsp, report.xbutton.y);
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            default: break;
          } /* end switch */
          break;
        default: break;
      }
    else if ((report.xany.window == dsp->NEGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->NEGrav, NorthEastGravity);
    else if ((report.xany.window == dsp->SEGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->SEGrav, SouthEastGravity);
    else if ((report.xany.window == dsp->SWGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->SWGrav, SouthWestGravity);
    else if ((report.xany.window == dsp->NWGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->NWGrav, NorthWestGravity);
    XFlush(dsp->display_id);
  } /* end while */
}